

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

_ElementType * __thiscall
Lib::
CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>
::next(_ElementType *__return_storage_ptr__,
      CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>
      *this)

{
  IteratorCore<Indexing::TermLiteralClause> *pIVar1;
  
  hasNext(this);
  if (this->_first == true) {
    pIVar1 = (this->_it1)._core;
  }
  else {
    pIVar1 = (this->_it2)._iter._core;
  }
  (*pIVar1->_vptr_IteratorCore[3])(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

OWN_ELEMENT_TYPE next()
  {
    ALWAYS(hasNext())
    if(_first) {
      //_it1 contains the next value, as hasNext must have
      //been called before. (It would have updated the
      //_first value otherwise.)
      return _it1.next();
    }
    return  _it2.next();
  }